

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O0

void do_tname(obj *obj)

{
  obj *local_10;
  obj *obj_local;
  
  local_10 = obj;
  if (obj == (obj *)0x0) {
    local_10 = getobj("\t\b\v\x04\x05\r\n\x03\x06","call",(obj **)0x0);
  }
  if (local_10 != (obj *)0x0) {
    examine_object(local_10);
    if ((*(uint *)&local_10->field_0x4a >> 5 & 1) == 0) {
      pline("You would never recognize another one.");
    }
    else {
      docall(local_10);
    }
  }
  return;
}

Assistant:

static void do_tname(struct obj *obj)
{
	if (!obj) obj = getobj(callable, "call", NULL);
	if (!obj) return;

	/* behave as if examining it in inventory;
	 * this might set dknown if it was picked up
	 * while blind and the hero can now see */
	examine_object(obj);

	if (!obj->dknown) {
	    pline("You would never recognize another one.");
	    return;
	}
	docall(obj);
}